

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void searchlight_plot(tgestate_t *state,attribute_t *attrs,int clip_left)

{
  int iVar1;
  zxspectrum_t *pzVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  attribute_t *paVar8;
  char cVar9;
  uint uVar10;
  uint8_t *puVar11;
  attribute_t *paVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  
  pzVar2 = state->speccy;
  paVar8 = (pzVar2->screen).attributes;
  puVar11 = "";
  uVar14 = 0;
  cVar9 = '\x10';
  do {
    iVar1 = state->width;
    lVar6 = ((long)attrs - (long)paVar8) % (long)iVar1;
    if (paVar8 + (int)(((0x15 < lVar6 && clip_left != 0) | 0x12) * iVar1) <= attrs) break;
    if (attrs < paVar8 + (iVar1 << (lVar6 < 7 || clip_left == 0))) {
      puVar11 = puVar11 + 2;
    }
    else {
      lVar6 = 2;
      bVar3 = false;
      paVar12 = attrs;
      do {
        uVar10 = (uint)*puVar11;
        lVar13 = 0;
        do {
          lVar7 = (long)(paVar12 + lVar13 + (-0x1830 - (long)pzVar2)) % (long)state->width;
          if (clip_left == 0) {
            if (0x1d < lVar7) {
              bVar5 = true;
              goto LAB_00108ebf;
            }
            if (6 < lVar7) goto LAB_00108e7f;
LAB_00108e66:
            uVar15 = (uVar10 & 0xff) >> 7;
          }
          else {
            if (lVar7 - 0x16U < 0xfffffffffffffff1) goto LAB_00108e66;
LAB_00108e7f:
            if ((char)uVar10 < '\0') {
              paVar12[lVar13] = '\x06';
              uVar15 = 1;
            }
            else {
              paVar12[lVar13] = 'A';
              uVar15 = 0;
            }
          }
          uVar10 = (uVar10 & 0xff) * 2 | uVar14;
          lVar13 = lVar13 + 1;
          uVar14 = uVar15;
        } while ((char)lVar13 != '\b');
        lVar6 = 1;
        bVar5 = false;
LAB_00108ebf:
        paVar12 = paVar12 + lVar13;
        puVar11 = puVar11 + lVar6;
        lVar6 = 1;
        bVar4 = !bVar3;
        bVar3 = true;
      } while (bVar4 && !bVar5);
    }
    attrs = attrs + state->width;
    cVar9 = cVar9 + -1;
  } while (cVar9 != '\0');
  (*state->speccy->draw)(state->speccy,&searchlight_plot::dirty);
  return;
}

Assistant:

void searchlight_plot(tgestate_t  *state,
                      attribute_t *attrs,
                      int          clip_left)
{
  /**
   * $AF3E: Searchlight circle shape.
   */
  static const uint8_t searchlight_shape[2 * 16] =
  {
    ________,________,
    ________,________,
    ________,________,
    _______X,X_______,
    _____XXX,XXX_____,
    ____XXXX,XXXX____,
    ____XXXX,XXXX____,
    ___XXXXX,XXXXX___,
    ___XXXXX,XXXXX___,
    ____XXXX,XXXX____,
    ____XXXX,XXXX____,
    _____XXX,XXX_____,
    _______X,X_______,
    ________,________,
    ________,________,
    ________,________
  };

  /* We can't ASSERT_SCREEN_ATTRIBUTES_PTR_VALID(attrs) here as expected as
   * the attrs pointer can be out of bounds... */

  attribute_t *const attrs_base = &state->speccy->screen.attributes[0];
  ASSERT_SCREEN_ATTRIBUTES_PTR_VALID(attrs_base);

{
  const uint8_t *shape;       /* was DE' */
  uint8_t        iters;       /* was C' */
  ptrdiff_t      x;           /* was A */
  attribute_t   *max_y_attrs; /* was HL */
  attribute_t   *saved_attrs; /* was stack */
  attribute_t   *min_y_attrs; /* was HL */
  uint8_t        iters2;      /* was B' */
  int            carry = 0;   /* added */

  /* Screen coords are x = 0..31, y = 0..23.
   * Game window occupies attribute rows 2..17 and columns 7..29 (inclusive).
   * Attribute row 18 is the row beyond the bottom edge of the game window.
   */

  // Conv: clip_left code was made a parameter, code handling it is hoisted.

  shape = &searchlight_shape[0];
  iters = 16; /* height */
  do
  {
    x = (attrs - attrs_base) % state->width; // Conv: was '& 31'. hoisted.

    // Finish if we're beyond the maximum y

    max_y_attrs = &attrs_base[18 * state->width]; // was HL = 0x5A40; // screen attribute address (column 0 + bottom of game screen)
    if (clip_left)
    {
      // BUG: This chunk seems to do nothing useful but allow the bottom
      // border to be overwritten. FUTURE: Remove.
      // Conv: was: if ((E & 31) >= 22) L = 32;
      if (x >= 22) // 22 => 8 attrs away from the edge maybe?
        max_y_attrs = &attrs_base[19 * state->width]; // row 19, column 0
    }
    if (attrs >= max_y_attrs) // gone off the end of the game screen?
      /* Conv: Original code just returned, instead goto exit so I can force
       * a screen refresh down there. */
      goto exit;

    saved_attrs = attrs; // PUSH DE

    // Clip/skip rows until we're in bounds

    min_y_attrs = &attrs_base[2 * state->width]; // screen attribute address (row 2, column 0)
    if (clip_left)
    {
      // BUG: Again, this chunk seems to do nothing useful but allow the
      // bottom border to be overwritten. FUTURE: Remove.
      // Conv: was: if (E & 31) >= 7) L = 32;
      if (x >= 7)
        min_y_attrs = &attrs_base[1 * state->width]; // row 1, column 0
    }
    if (attrs < min_y_attrs)
    {
      shape += 2;
      goto next_row;
    }

    iters2 = 2; /* iterations - rowbytes */
    do
    {
      uint8_t iters3; /* was B */
      uint8_t pixels; /* was C */

      pixels = *shape; // Conv: Original uses A as temporary.

      iters3 = 8; /* iterations - bits per byte */
      do
      {
        x = (attrs - attrs_base) % state->width;  // Conv: was '& 31'. was interleaved; '& 31's hoisted from below

        /* clip right hand edge */

        // i don't presently see any evidence that this chunk affects anything in the game, bcbw
        // does this stop us sliding into the next scanline of data?
        if (clip_left)
        {
          if (x >= 22)
            goto dont_plot; // this doesn't skip the whole remainder of the row unlike the case below
        }
        else
        {
          if (x >= 30) // Conv: Constant 30 was in E
          {
            shape += iters2; /* Conv: Was a loop. */
            goto next_row; // skip whole row
          }
        }

        /* clip left hand edge */

        if (x < 7) // Conv: Constant 7 was in D
        {
          /* Don't render leftwards of the game window */
dont_plot:
          RL(pixels); // no plot
        }
        else
        {
          // plot
          RL(pixels);
          if (carry)
            *attrs = attribute_YELLOW_OVER_BLACK;
          else
            *attrs = attribute_BRIGHT_BLUE_OVER_BLACK;
        }
        attrs++;
      }
      while (--iters3);

      shape++;
    }
    while (--iters2);

next_row:
    attrs = saved_attrs + state->width;
  }
  while (--iters);

exit:
  {
    /* FUTURE: Make the dirty rectangle more accurate. */
    static const zxbox_t dirty = { 7 * 8, 2 * 8, 29 * 8, 17 * 8 };
    state->speccy->draw(state->speccy, &dirty);
  }
}
}